

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

void __thiscall
H264StreamReader::additionalStreamCheck(H264StreamReader *this,uint8_t *buff,uint8_t *end)

{
  _Hash_node_base *p_Var1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  int picOrder;
  SliceUnit slice;
  SEIUnit sei;
  SPSUnit tmpsps;
  PPSUnit local_500;
  PPSUnit local_4a8;
  SliceUnit local_450;
  SEIUnit local_3d0;
  SPSUnit local_230;
  
  SliceUnit::SliceUnit(&local_450);
  SPSUnit::SPSUnit(&local_230);
  local_500.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
  local_500.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  local_500.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  local_500.super_NALUnit.bitReader.m_curVal = 0;
  local_500.super_NALUnit.bitReader.m_bitLeft = 0;
  local_500.super_NALUnit.nal_unit_type = nuUnspecified;
  local_500.super_NALUnit.nal_ref_idc = 0;
  local_500.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
  local_500.super_NALUnit.m_nalBufferLen = 0;
  local_500.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023d550;
  local_500.pic_parameter_set_id = 0;
  local_500.seq_parameter_set_id = 0;
  local_500.entropy_coding_mode_flag = 1;
  local_500.pic_order_present_flag = 1;
  local_500.m_ready = false;
  local_3d0.m_processedMessages._M_h._M_buckets =
       &local_3d0.m_processedMessages._M_h._M_single_bucket;
  local_3d0.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
  local_3d0.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  local_3d0.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  local_3d0.super_NALUnit.bitReader.m_curVal = 0;
  local_3d0.super_NALUnit.bitReader.m_bitLeft = 0;
  local_3d0.super_NALUnit.nal_unit_type = nuUnspecified;
  local_3d0.super_NALUnit.nal_ref_idc = 0;
  local_3d0.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
  local_3d0.super_NALUnit.m_nalBufferLen = 0;
  local_3d0.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0023d5a0;
  local_3d0.pic_struct = '\0';
  local_3d0.m_processedMessages._M_h._M_bucket_count = 1;
  local_3d0.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_3d0.m_processedMessages._M_h._M_element_count = 0;
  local_3d0.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&local_3d0.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
  local_3d0.number_of_offset_sequences = -1;
  local_3d0.metadataPtsOffset = 0;
  local_3d0.m_mvcHeaderLen = 0;
  local_3d0.m_mvcHeaderStart = (uint8_t *)0x0;
  pbVar10 = NALUnit::findNextNAL(buff,end);
  bVar4 = 0;
  bVar2 = 0;
  bVar5 = false;
LAB_00185ad3:
  if (pbVar10 != end) {
    switch(*pbVar10 & 0x1f) {
    case 6:
      if (!bVar5) {
        bVar5 = false;
        break;
      }
      puVar11 = NALUnit::findNALWithStartCode(pbVar10,end,true);
      bVar5 = true;
      if (puVar11 == end) break;
      NALUnit::decodeBuffer(&local_3d0.super_NALUnit,pbVar10,puVar11);
      uVar7 = (uint)this->orig_vcl_parameters_present_flag;
      if (this->orig_hrd_parameters_present_flag != false) {
        uVar7 = 1;
      }
      SEIUnit::deserialize(&local_3d0,&local_230,uVar7);
      if (*local_3d0.m_processedMessages._M_h._M_buckets != (__node_base_ptr)0x0) {
        p_Var1 = (*local_3d0.m_processedMessages._M_h._M_buckets)->_M_nxt;
        iVar8 = *(int *)&p_Var1[1]._M_nxt;
        do {
          if (iVar8 == 0) goto LAB_00185d7d;
          p_Var1 = p_Var1->_M_nxt;
        } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                (iVar8 = *(int *)&p_Var1[1]._M_nxt,
                (ulong)(long)iVar8 % local_3d0.m_processedMessages._M_h._M_bucket_count == 0));
      }
      if (local_3d0.m_processedMessages._M_h._M_buckets
          [local_3d0.m_processedMessages._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
        p_Var1 = local_3d0.m_processedMessages._M_h._M_buckets
                 [local_3d0.m_processedMessages._M_h._M_bucket_count != 1]->_M_nxt;
        iVar8 = *(int *)&p_Var1[1]._M_nxt;
        do {
          if (iVar8 == 1) goto LAB_00185d7d;
          p_Var1 = p_Var1->_M_nxt;
        } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                (iVar8 = *(int *)&p_Var1[1]._M_nxt,
                (ulong)(long)iVar8 % local_3d0.m_processedMessages._M_h._M_bucket_count ==
                (ulong)(local_3d0.m_processedMessages._M_h._M_bucket_count != 1)));
      }
      goto LAB_00185d84;
    case 8:
      local_4a8.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
      local_4a8.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
      local_4a8.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
      local_4a8.super_NALUnit.bitReader.m_curVal = 0;
      local_4a8.super_NALUnit.bitReader.m_bitLeft = 0;
      local_4a8.super_NALUnit.m_nalBufferLen = 0;
      local_4a8.super_NALUnit.nal_unit_type = nuUnspecified;
      local_4a8.super_NALUnit.nal_ref_idc = 0;
      local_4a8.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
      local_4a8.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023d550;
      local_4a8.pic_parameter_set_id = 0;
      local_4a8.seq_parameter_set_id = 0;
      local_4a8.entropy_coding_mode_flag = 1;
      local_4a8.pic_order_present_flag = 1;
      local_4a8.m_ready = false;
      puVar11 = NALUnit::findNALWithStartCode
                          (pbVar10,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                   m_bufEnd,true);
      if (local_500.super_NALUnit.m_nalBufferLen == 0) {
        NALUnit::decodeBuffer(&local_500.super_NALUnit,pbVar10,puVar11);
        PPSUnit::deserialize(&local_500);
      }
      NALUnit::decodeBuffer(&local_4a8.super_NALUnit,pbVar10,puVar11);
      PPSUnit::deserialize(&local_4a8);
      puVar11 = local_4a8.super_NALUnit.m_nalBuffer;
      puVar12 = puVar11;
      bVar3 = bVar2;
      if (local_500.pic_parameter_set_id == local_4a8.pic_parameter_set_id) {
        bVar3 = 1;
        if ((local_4a8.super_NALUnit.m_nalBufferLen == local_500.super_NALUnit.m_nalBufferLen) &&
           (iVar8 = bcmp(local_4a8.super_NALUnit.m_nalBuffer,local_500.super_NALUnit.m_nalBuffer,
                         (ulong)local_4a8.super_NALUnit.m_nalBufferLen),
           puVar12 = local_4a8.super_NALUnit.m_nalBuffer, iVar8 == 0)) {
          puVar12 = puVar11;
          bVar3 = bVar2;
        }
      }
      local_4a8.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
      bVar2 = bVar3;
      if (puVar12 != (uint8_t *)0x0) {
        operator_delete__(puVar12);
      }
      break;
    case 0xf:
      this->m_mvcSubStream = true;
    case 7:
      puVar11 = NALUnit::findNALWithStartCode
                          (pbVar10,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                   m_bufEnd,true);
      NALUnit::decodeBuffer(&local_230.super_NALUnit,pbVar10,puVar11);
      SPSUnit::deserialize(&local_230);
      this->orig_hrd_parameters_present_flag = local_230.nalHrdParams.isPresent;
      this->orig_vcl_parameters_present_flag = local_230.vclHrdParams.isPresent;
      bVar5 = true;
    }
    goto switchD_00185af8_caseD_9;
  }
  if ((this->super_MPEGStreamReader).m_removePulldown == false) {
    if (this->m_insertSEIMethod == SEI_InsertAuto) {
      bVar5 = (bool)(~bVar4 & 1 |
                    (this->orig_vcl_parameters_present_flag == false ||
                    this->orig_hrd_parameters_present_flag == false));
      this->m_needSeiCorrection = bVar5;
      if ((bVar5 & bVar2) != 1) goto LAB_00185e53;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "H264 stream contains different PPS with same pps_id. SEI correction is turned off"
                 ,0x51);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      sLastMsg = true;
    }
    else if (this->m_insertSEIMethod == SEI_InsertForce) goto LAB_00185dbc;
    this->m_needSeiCorrection = false;
  }
  else {
LAB_00185dbc:
    this->m_needSeiCorrection = true;
  }
LAB_00185e53:
  this->m_forceLsbDiv = -1;
  pbVar10 = NALUnit::findNextNAL(buff,end);
  for (; pbVar10 != end; pbVar10 = NALUnit::findNextNAL(pbVar10,end)) {
    uVar7 = *pbVar10 & 0x1f;
    if (uVar7 < 0x15) {
      if ((0x10003eU >> uVar7 & 1) == 0) {
        if ((0x8080U >> uVar7 & 1) == 0) {
          if (uVar7 == 8) {
            processPPS(this,pbVar10);
          }
        }
        else {
          processSPS(this,pbVar10);
        }
      }
      else {
        iVar8 = deserializeSliceHeader(this,&local_450,pbVar10,end);
        if ((iVar8 == 0) &&
           ((((local_450.sps)->frame_mbs_only_flag == 0 &&
             (iVar8 = 1, local_450.m_field_pic_flag != 0)) ||
            (iVar8 = 0, ((byte)local_450.pic_order_cnt_lsb & 1) != 0)))) {
          this->m_forceLsbDiv = iVar8;
        }
      }
    }
  }
  if (this->m_forceLsbDiv == -1) {
    this->m_forceLsbDiv = 1;
  }
  pbVar10 = NALUnit::findNextNAL(buff,end);
  iVar8 = -1;
  for (; pbVar10 != end; pbVar10 = NALUnit::findNextNAL(pbVar10,end)) {
    if ((((*pbVar10 & 0x1f) - 1 < 5) || ((*pbVar10 & 0x1f) == 0x14)) &&
       ((iVar9 = deserializeSliceHeader(this,&local_450,pbVar10,end),
        iVar9 == 0 && local_450.first_mb_in_slice == 0 && ((local_450.sps)->pic_order_cnt_type != 2)
        ))) {
      iVar9 = calcPicOrder(this,&local_450);
      local_4a8.super_NALUnit._vptr_NALUnit =
           (_func_int **)CONCAT44(local_4a8.super_NALUnit._vptr_NALUnit._4_4_,iVar9);
      bVar5 = SliceUnit::isIDR(&local_450);
      bVar6 = SliceUnit::isIFrame(&local_450);
      if (bVar6) {
        this->m_fieldFirst = local_450.bottom_field_flag;
      }
      iVar8 = iVar8 + 1;
      if (bVar5) {
        iVar8 = 0;
      }
      checkPyramid(this,iVar8,(int *)&local_4a8,true);
    }
  }
  this->prevPicOrderCntMsb = 0;
  this->prevPicOrderCntLsb = 0;
  SEIUnit::~SEIUnit(&local_3d0);
  local_500.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
  if (local_500.super_NALUnit.m_nalBuffer != (uint8_t *)0x0) {
    operator_delete__(local_500.super_NALUnit.m_nalBuffer);
  }
  SPSUnit::~SPSUnit(&local_230);
  local_450.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
  if (local_450.super_NALUnit.m_nalBuffer != (uint8_t *)0x0) {
    operator_delete__(local_450.super_NALUnit.m_nalBuffer);
  }
  return;
LAB_00185d7d:
  bVar4 = 1;
LAB_00185d84:
  if (-1 < local_3d0.number_of_offset_sequences) {
    this->number_of_offset_sequences = local_3d0.number_of_offset_sequences;
  }
switchD_00185af8_caseD_9:
  pbVar10 = NALUnit::findNextNAL(pbVar10,end);
  goto LAB_00185ad3;
}

Assistant:

void H264StreamReader::additionalStreamCheck(uint8_t *buff, uint8_t *end)
{
    // Make sure that the stream doesn't appear to be progressive, since pic_order_cnt_lsb doesn't reach values higher
    // than 2 in these streams.
    bool SEIFound = false;
    SliceUnit slice;
    SPSUnit tmpsps;

    PPSUnit pps1;
    bool differPPS = false;

    int rez = 0;
    SEIUnit sei;
    uint8_t *nalEnd = nullptr;
    bool tmpspsfound = false;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSubSPS:
            m_mvcSubStream = true;
            [[fallthrough]];
        case NALUnit::NALType::nuSPS:
            nalEnd = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
            tmpsps.decodeBuffer(nal, nalEnd);
            tmpsps.deserialize();
            orig_hrd_parameters_present_flag = tmpsps.nalHrdParams.isPresent;
            orig_vcl_parameters_present_flag = tmpsps.vclHrdParams.isPresent;
            tmpspsfound = true;
            break;
        case NALUnit::NALType::nuPPS:
        {
            PPSUnit pps2;
            nalEnd = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
            if (pps1.m_nalBufferLen == 0)
            {
                pps1.decodeBuffer(nal, nalEnd);
                pps1.deserialize();
            }
            pps2.decodeBuffer(nal, nalEnd);
            pps2.deserialize();
            if (pps1.pic_parameter_set_id == pps2.pic_parameter_set_id)
            {
                if (pps2.m_nalBufferLen != pps1.m_nalBufferLen ||
                    memcmp(pps2.m_nalBuffer, pps1.m_nalBuffer, pps1.m_nalBufferLen) != 0)
                    differPPS = true;
            }
            break;
        }
        case NALUnit::NALType::nuSEI:
            if (tmpspsfound)
            {
                nalEnd = NALUnit::findNALWithStartCode(nal, end, true);
                if (nalEnd == end)
                    break;
                sei.decodeBuffer(nal, nalEnd);
                sei.deserialize(tmpsps, orig_hrd_parameters_present_flag || orig_vcl_parameters_present_flag);
                if (sei.hasProcessedMessage(SEI_MSG_BUFFERING_PERIOD) || sei.hasProcessedMessage(SEI_MSG_PIC_TIMING))
                {
                    SEIFound = true;
                }

                if (sei.number_of_offset_sequences >= 0)
                {
                    number_of_offset_sequences = sei.number_of_offset_sequences;
                }
            }
            break;
        default:
            break;
        }
    }

    if (m_removePulldown || m_insertSEIMethod == SeiMethod::SEI_InsertForce)
        m_needSeiCorrection = true;
    else if (m_insertSEIMethod == SeiMethod::SEI_InsertAuto)
    {
        m_needSeiCorrection =
            orig_hrd_parameters_present_flag == 0 || orig_vcl_parameters_present_flag == 0 || !SEIFound;
        if (m_needSeiCorrection && differPPS)
        {
            LTRACE(LT_INFO, 2, "H264 stream contains different PPS with same pps_id. SEI correction is turned off");
            m_needSeiCorrection = false;
        }
    }
    else
        m_needSeiCorrection = false;

    m_forceLsbDiv = -1;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSPS:
        case NALUnit::NALType::nuSubSPS:
            processSPS(nal);
            break;
        case NALUnit::NALType::nuPPS:
            processPPS(nal);
            break;
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            rez = deserializeSliceHeader(slice, nal, end);
            if (rez == 0)
            {
                // coded fields
                if (slice.getSPS()->frame_mbs_only_flag == 0 && slice.m_field_pic_flag)
                    m_forceLsbDiv = 1;
                // coded frames
                else if (slice.pic_order_cnt_lsb % 2 == 1)
                    m_forceLsbDiv = 0;
            }
            break;
        default:
            break;
        }
    }

    if (m_forceLsbDiv == -1)
        m_forceLsbDiv = 1;

    int frameNum = -1;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            rez = deserializeSliceHeader(slice, nal, end);
            if (rez == 0 && slice.first_mb_in_slice == 0 && slice.getSPS()->pic_order_cnt_type != 2)
            {
                int picOrder = calcPicOrder(slice);
                if (slice.isIDR())
                    frameNum = -1;
                if (slice.isIFrame())
                    m_fieldFirst = slice.bottom_field_flag;
                checkPyramid(++frameNum, &picOrder, true);
            }
            break;
        default:
            break;
        }
    }
    prevPicOrderCntMsb = prevPicOrderCntLsb = 0;
}